

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

CharacterCounts __thiscall
ON_XMLNode::WriteChildrenToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat,bool sortedProperties)

{
  int iVar1;
  undefined4 extraout_var;
  uint *puVar2;
  int local_70 [2];
  undefined1 local_68 [8];
  CharacterCounts cc;
  undefined1 local_48 [8];
  ChildIterator it;
  ON_XMLNode *pChild;
  bool sortedProperties_local;
  bool forceLongFormat_local;
  bool includeFormatting_local;
  wchar_t *pwStack_28;
  ON__UINT32 max_chars_local;
  wchar_t *stream_local;
  ON_XMLNode *this_local;
  CharacterCounts counts;
  
  CharacterCounts::CharacterCounts((CharacterCounts *)&this_local);
  it._private = (ON_XMLNodeChildIteratorPrivate *)0x0;
  (*this->_vptr_ON_XMLNode[0x2c])(local_48);
  pChild._4_4_ = max_chars;
  pwStack_28 = stream;
  while( true ) {
    it._private = (ON_XMLNodeChildIteratorPrivate *)
                  ChildIterator::GetNextChild((ChildIterator *)local_48);
    if ((ON_XMLNode *)it._private == (ON_XMLNode *)0x0) break;
    iVar1 = (*((ON_XMLNode *)it._private)->_vptr_ON_XMLNode[0x1c])
                      (it._private,pwStack_28,(ulong)pChild._4_4_,(ulong)(includeFormatting & 1),
                       (ulong)(forceLongFormat & 1),(ulong)(sortedProperties & 1));
    local_68 = (undefined1  [8])CONCAT44(extraout_var,iVar1);
    CharacterCounts::operator+=((CharacterCounts *)&this_local,(CharacterCounts *)local_68);
    if (pwStack_28 != (wchar_t *)0x0) {
      pwStack_28 = pwStack_28 + ((ulong)local_68 >> 0x20);
    }
    local_70[1] = 0;
    local_70[0] = pChild._4_4_ - local_68._0_4_;
    puVar2 = (uint *)std::max<int>(local_70 + 1,local_70);
    pChild._4_4_ = *puVar2;
  }
  ChildIterator::~ChildIterator((ChildIterator *)local_48);
  return _this_local;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteChildrenToStream(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  CharacterCounts counts;

  ON_XMLNode* pChild = nullptr;
  auto it = GetChildIterator();
  while (nullptr != (pChild = it.GetNextChild()))
  {
    const auto cc = pChild->WriteToStreamEx(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
    counts += cc;
    if (nullptr != stream)
      stream += cc._physical;
    max_chars = std::max(0, int(max_chars - cc._logical));
  }

  return counts;
}